

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniDFS.cpp
# Opt level: O2

bool __thiscall NameServer::assignFetchWork(NameServer *this)

{
  _Base_ptr p_Var1;
  int iVar2;
  iterator iVar3;
  iterator iVar4;
  iterator iVar5;
  ostream *poVar6;
  _Base_ptr p_Var7;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> b;
  
  if (type == fetch) {
    iVar3 = std::
            _Rb_tree<int,_std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long_long>_>,_std::_Select1st<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long_long>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long_long>_>_>_>
            ::find(&fileid_path_lenMap_abi_cxx11_._M_t,&fetch_id);
    if ((_Rb_tree_header *)iVar3._M_node ==
        &fileid_path_lenMap_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
      poVar6 = std::operator<<((ostream *)&std::cerr,"No such file with id = ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,fetch_id);
      goto LAB_001185f6;
    }
    std::__cxx11::string::_M_assign((string *)&fetch_filepath_abi_cxx11_);
  }
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::find(&logicFile_BlockFileMap_abi_cxx11_._M_t,&fetch_filepath_abi_cxx11_);
  if ((_Rb_tree_header *)iVar4._M_node !=
      &logicFile_BlockFileMap_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    p_Var7 = *(_Base_ptr *)(iVar4._M_node + 2);
    p_Var1 = iVar4._M_node[2]._M_parent;
    fetch_blocks = (int)((ulong)((long)p_Var1 - (long)p_Var7) >> 5);
    for (; p_Var7 != p_Var1; p_Var7 = p_Var7 + 1) {
      std::__cxx11::string::string((string *)&b,(string *)p_Var7);
      std::__cxx11::string::find_last_of((char *)&b,0x13236e);
      std::__cxx11::string::substr((ulong)&local_70,(ulong)&b);
      iVar2 = std::__cxx11::stoi(&local_70,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)&local_70);
      iVar5 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::find(&block_serversMap_abi_cxx11_._M_t,&b);
      fetch_servers[iVar2] = **(int **)(iVar5._M_node + 2);
      std::__cxx11::string::~string((string *)&b);
    }
    return true;
  }
  poVar6 = std::operator<<((ostream *)&std::cerr,"No such file with path = ");
  poVar6 = std::operator<<(poVar6,(string *)&fetch_filepath_abi_cxx11_);
LAB_001185f6:
  std::endl<char,std::char_traits<char>>(poVar6);
  return false;
}

Assistant:

bool assignFetchWork() const
    {

        if (type == MsgType::fetch)
        {
            auto fileInfo = fileid_path_lenMap.find(fetch_id);
            if (fileInfo == fileid_path_lenMap.end())
            {
                cerr << "No such file with id = " << fetch_id << endl;
                return false;
            }
            fetch_filepath = fileInfo->second.first;
        }

        auto all_blocks = logicFile_BlockFileMap.find(fetch_filepath);

        if (all_blocks == logicFile_BlockFileMap.end())
        {
            cerr << "No such file with path = " << fetch_filepath << endl;
            return false;
        }

        fetch_blocks = all_blocks->second.size();

                // block_serversMap
        for (auto b : all_blocks->second)
        {
            auto part_pos = b.find_last_of("part");
            int blockID = stoi(b.substr(part_pos + 1));
            auto servers = block_serversMap.find(b);
            fetch_servers[blockID] = servers->second[0];

        }

        return true;
    }